

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grob_array.h
# Opt level: O1

void __thiscall lume::GrobArray::push_back(GrobArray *this,initializer_list<unsigned_int> inds)

{
  iterator __position;
  uint uVar1;
  ulong uVar2;
  BadNumberOfIndices *this_00;
  char *pcVar3;
  string *what;
  unsigned_long __val;
  long lVar4;
  uint __val_00;
  uint i;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  __val = inds._M_len;
  uVar1 = (this->m_grobDesc).m_offset;
  if (*(int *)(impl::GROB_DESCS + (ulong)uVar1 * 4) == 0) {
    uVar2 = 1;
  }
  else {
    uVar1 = uVar1 + *(int *)(impl::GROB_DESCS + (ulong)(uVar1 + 1) * 4) + 2;
    uVar2 = (ulong)*(uint *)(impl::GROB_DESCS +
                            (ulong)(uVar1 + *(int *)(impl::GROB_DESCS + (ulong)uVar1 * 4)) * 4);
  }
  if (uVar2 == __val) {
    if (__val != 0) {
      lVar4 = 0;
      do {
        uVar1 = *(uint *)((long)inds._M_array + lVar4);
        local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,uVar1);
        __position._M_current =
             (this->m_array).m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_array).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->m_array).m_vector,
                     __position,(uint *)local_90);
        }
        else {
          *__position._M_current = uVar1;
          (this->m_array).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        lVar4 = lVar4 + 4;
      } while (__val << 2 != lVar4);
    }
    return;
  }
  this_00 = (BadNumberOfIndices *)__cxa_allocate_exception(0x50);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"expected: ","");
  uVar1 = (this->m_grobDesc).m_offset;
  __val_00 = 1;
  if (*(int *)(impl::GROB_DESCS + (ulong)uVar1 * 4) != 0) {
    uVar1 = uVar1 + *(int *)(impl::GROB_DESCS + (ulong)(uVar1 + 1) * 4) + 2;
    __val_00 = *(uint *)(impl::GROB_DESCS +
                        (ulong)(uVar1 + *(int *)(impl::GROB_DESCS + (ulong)uVar1 * 4)) * 4);
  }
  std::__cxx11::to_string(&local_50,__val_00);
  pcVar3 = (char *)std::__cxx11::string::_M_append
                             ((char *)local_90,(ulong)local_50._M_dataplus._M_p);
  pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
  std::__cxx11::to_string(&local_70,__val);
  what = (string *)std::__cxx11::string::_M_append(pcVar3,(ulong)local_70._M_dataplus._M_p);
  BadNumberOfIndices::BadNumberOfIndices(this_00,what);
  __cxa_throw(this_00,&BadNumberOfIndices::typeinfo,BadNumberOfIndices::~BadNumberOfIndices);
}

Assistant:

inline void push_back (std::initializer_list <index_t> inds)
	{
		using std::string;
		using std::to_string;

		if (inds.size() != num_grob_corners())
			throw BadNumberOfIndices (string ("expected: ").
			                          append (to_string (num_grob_corners())).
			                          append (", given: ").
			                          append (to_string (inds.size())));

		for(auto i : inds) 
			m_array.push_back (i);
	}